

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

SegmentBTreeRoot * __thiscall Js::JavascriptArray::BuildSegmentMap(JavascriptArray *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this_00;
  Recycler *this_01;
  undefined4 *puVar4;
  SegmentBTreeRoot *this_02;
  uint uVar5;
  SparseArraySegmentBase *newSeg;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  this_00 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  local_60 = (undefined1  [8])&SegmentBTreeRoot::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_6ad2a13;
  data.filename._0_4_ = 0xa6a;
  this_01 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_60);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00b70e7f;
    *puVar4 = 0;
  }
  this_02 = (SegmentBTreeRoot *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                      (this_01,0x28);
  if (this_02 == (SegmentBTreeRoot *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00b70e7f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  *(undefined8 *)((long)&(this_02->super_SegmentBTree).segments.ptr + 4) = 0;
  *(undefined8 *)((long)&(this_02->super_SegmentBTree).children.ptr + 4) = 0;
  (this_02->super_SegmentBTree).keys.ptr = (uint *)0x0;
  (this_02->super_SegmentBTree).segments.ptr = (SparseArraySegmentBase **)0x0;
  (this_02->lastUsedSegment).ptr = (SparseArraySegmentBase *)0x0;
  newSeg = (this->head).ptr;
  data._32_8_ = this;
  if (newSeg != (SparseArraySegmentBase *)0x0) {
    uVar5 = newSeg->left;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (newSeg->left < uVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                    ,0x35,"(current->left >= lastindex)",
                                    "current->left >= lastindex");
        if (!bVar2) goto LAB_00b70e7f;
        *puVar4 = 0;
      }
      SegmentBTreeRoot::Add(this_02,this_00,newSeg);
      uVar5 = newSeg->length + newSeg->left;
      newSeg = (newSeg->next).ptr;
    } while (newSeg != (SparseArraySegmentBase *)0x0);
  }
  SetSegmentMap((JavascriptArray *)data._32_8_,this_02);
  return this_02;
}

Assistant:

SegmentBTreeRoot * JavascriptArray::BuildSegmentMap()
    {
        Recycler* recycler = GetRecycler();
        SegmentBTreeRoot* tmpSegmentMap = AllocatorNewStruct(Recycler, recycler, SegmentBTreeRoot);
        ForEachSegment([recycler, tmpSegmentMap](SparseArraySegmentBase * current)
        {
            tmpSegmentMap->Add(recycler, current);
            return false;
        });

        // There could be OOM during building segment map. Save to array only after its successful completion.
        SetSegmentMap(tmpSegmentMap);
        return tmpSegmentMap;
    }